

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::urem(APInt *this,APInt *RHS)

{
  bool bVar1;
  uint uVar2;
  uint BitWidth;
  uint rhsWords_00;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar3;
  APInt AVar4;
  uint rhsWords;
  uint rhsBits;
  uint lhsWords;
  APInt *RHS_local;
  APInt *this_local;
  APInt *Remainder;
  
  if (RHS->BitWidth != in_RDX->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x658,"APInt llvm::APInt::urem(const APInt &) const");
  }
  bVar1 = isSingleWord(RHS);
  if (bVar1) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Remainder by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x65a,"APInt llvm::APInt::urem(const APInt &) const");
    }
    APInt(this,RHS->BitWidth,(RHS->U).VAL % (in_RDX->U).VAL,false);
    uVar3 = extraout_RDX;
  }
  else {
    uVar2 = getActiveBits(RHS);
    uVar2 = getNumWords(uVar2);
    BitWidth = getActiveBits(in_RDX);
    rhsWords_00 = getNumWords(BitWidth);
    if (rhsWords_00 == 0) {
      __assert_fail("rhsWords && \"Performing remainder operation by zero ???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x664,"APInt llvm::APInt::urem(const APInt &) const");
    }
    if (uVar2 == 0) {
      APInt(this,RHS->BitWidth,0,false);
      uVar3 = extraout_RDX_00;
    }
    else if (BitWidth == 1) {
      APInt(this,RHS->BitWidth,0,false);
      uVar3 = extraout_RDX_01;
    }
    else if ((uVar2 < rhsWords_00) || (bVar1 = ult(RHS,in_RDX), bVar1)) {
      APInt(this,RHS);
      uVar3 = extraout_RDX_02;
    }
    else {
      bVar1 = operator==(RHS,in_RDX);
      if (bVar1) {
        APInt(this,RHS->BitWidth,0,false);
        uVar3 = extraout_RDX_03;
      }
      else if (uVar2 == 1) {
        APInt(this,RHS->BitWidth,*(RHS->U).pVal % *(in_RDX->U).pVal,false);
        uVar3 = extraout_RDX_04;
      }
      else {
        APInt(this,RHS->BitWidth,0,false);
        divide((RHS->U).pVal,uVar2,(in_RDX->U).pVal,rhsWords_00,(WordType *)0x0,(this->U).pVal);
        uVar3 = extraout_RDX_05;
      }
    }
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::urem(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Remainder by zero?");
    return APInt(BitWidth, U.VAL % RHS.U.VAL);
  }

  // Get some facts about the LHS
  unsigned lhsWords = getNumWords(getActiveBits());

  // Get some facts about the RHS
  unsigned rhsBits = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing remainder operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0)
    // 0 % Y ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X % 1 ===> 0
    return APInt(BitWidth, 0);
  if (lhsWords < rhsWords || this->ult(RHS))
    // X % Y ===> X, iff X < Y
    return *this;
  if (*this == RHS)
    // X % X == 0;
    return APInt(BitWidth, 0);
  if (lhsWords == 1)
    // All high words are zero, just use native remainder
    return APInt(BitWidth, U.pVal[0] % RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Remainder(BitWidth, 0);
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, nullptr, Remainder.U.pVal);
  return Remainder;
}